

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)

{
  SQObjectPtr *pSVar1;
  SQClass *x;
  SQClass *base;
  SQObjectPtr SStack_28;
  
  if (hasbase == 0) {
    base = (SQClass *)0x0;
  }
  else {
    pSVar1 = SQVM::GetUp(v,-1);
    if ((pSVar1->super_SQObject)._type != OT_CLASS) {
      sq_throwerror(v,"invalid base type");
      return -1;
    }
    base = (pSVar1->super_SQObject)._unVal.pClass;
  }
  x = SQClass::Create(v->_sharedstate,base);
  if (base != (SQClass *)0x0) {
    SQVM::Pop(v);
  }
  SQObjectPtr::SQObjectPtr(&SStack_28,x);
  SQVM::Push(v,&SStack_28);
  SQObjectPtr::~SQObjectPtr(&SStack_28);
  return 0;
}

Assistant:

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)
{
    SQClass *baseclass = NULL;
    if(hasbase) {
        SQObjectPtr &base = stack_get(v,-1);
        if(type(base) != OT_CLASS)
            return sq_throwerror(v,_SC("invalid base type"));
        baseclass = _class(base);
    }
    SQClass *newclass = SQClass::Create(_ss(v), baseclass);
    if(baseclass) v->Pop();
    v->Push(newclass);
    return SQ_OK;
}